

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger table_map(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  uint uVar2;
  SQObjectType SVar3;
  SQSharedState *ss;
  SQObjectValue this;
  long lVar4;
  SQObjectPtr *pSVar5;
  SQObjectValue SVar6;
  SQRESULT SVar7;
  SQInteger SVar8;
  SQObjectPtr itr;
  SQObjectPtr ret;
  SQObjectPtr val;
  SQObjectPtr temp;
  SQObjectPtr key;
  SQObjectPtr local_a8;
  SQObjectPtr local_98;
  SQObjectPtr local_88;
  SQObject local_78;
  SQObject local_68;
  SQObjectValue local_50;
  SQObject local_48;
  
  pSVar5 = SQVM::GetAt(v,v->_stackbase);
  ss = v->_sharedstate;
  uVar2 = ((pSVar5->super_SQObject)._unVal.pTable)->_usednodes;
  SVar6.pUserPointer = sq_vm_malloc(ss->_alloc_ctx,0x60);
  SQTable::SQTable(SVar6.pTable,ss,(ulong)uVar2);
  ((SVar6.pTable)->super_SQDelegable)._delegate = (SQTable *)0x0;
  local_88.super_SQObject._type = OT_TABLE;
  local_88.super_SQObject._flags = '\0';
  pSVar1 = &((SVar6.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  this = (SQObjectValue)(pSVar5->super_SQObject)._unVal.pTable;
  local_68._unVal.pTable = (SQTable *)0x0;
  local_68._type = OT_NULL;
  local_68._flags = '\0';
  local_68._5_3_ = 0;
  local_88.super_SQObject._unVal.pUserPointer = SVar6.pUserPointer;
  local_50.pUserPointer = SVar6.pUserPointer;
  pSVar5 = SQVM::GetAt(v,v->_stackbase + 1);
  local_a8.super_SQObject._type = (pSVar5->super_SQObject)._type;
  local_a8.super_SQObject._flags = (pSVar5->super_SQObject)._flags;
  local_a8.super_SQObject._5_3_ = *(undefined3 *)&(pSVar5->super_SQObject).field_0x5;
  local_a8.super_SQObject._unVal = (SQObjectValue)(pSVar5->super_SQObject)._unVal.pTable;
  if ((local_a8.super_SQObject._0_8_ & 0x8000000) != 0) {
    pSVar1 = &((local_a8.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQVM::Push(v,&local_a8);
  SQObjectPtr::~SQObjectPtr(&local_a8);
  SVar3 = (pSVar5->super_SQObject)._type;
  if (SVar3 == OT_NATIVECLOSURE) {
    lVar4 = ((pSVar5->super_SQObject)._unVal.pNativeClosure)->_nparamscheck;
    SVar8 = 4;
    if (0 < lVar4) {
      SVar8 = lVar4;
    }
  }
  else {
    SVar8 = -1;
    if (SVar3 == OT_CLOSURE) {
      SVar8 = ((pSVar5->super_SQObject)._unVal.pClosure)->_function->_nparameters;
    }
  }
  local_a8.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_a8.super_SQObject._type = OT_NULL;
  local_a8.super_SQObject._flags = '\0';
  local_a8.super_SQObject._5_3_ = 0;
  local_48._unVal.pTable = (SQTable *)0x0;
  local_48._type = OT_NULL;
  local_48._flags = '\0';
  local_48._5_3_ = 0;
  local_78._unVal.pTable = (SQTable *)0x0;
  local_78._type = OT_NULL;
  local_78._flags = '\0';
  local_78._5_3_ = 0;
  do {
    while( true ) {
      SVar6.nInteger =
           SQTable::Next(this.pTable,false,&local_a8,(SQObjectPtr *)&local_48,
                         (SQObjectPtr *)&local_78);
      if (SVar6.pTable == (SQTable *)0xffffffffffffffff) {
        SQVM::Pop(v);
        goto LAB_0011ca1b;
      }
      if ((local_a8.super_SQObject._0_8_ & 0x8000000) != 0) {
        pSVar1 = &((local_a8.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*((local_a8.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._vptr_SQRefCounted[2])();
        }
      }
      local_a8.super_SQObject._0_5_ = 0x5000002;
      local_98.super_SQObject._type = OT_TABLE;
      local_98.super_SQObject._flags = '\0';
      pSVar1 = &((this.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      local_a8.super_SQObject._unVal.nInteger = SVar6.nInteger;
      local_98.super_SQObject._unVal = this;
      SQVM::Push(v,&local_98);
      SQObjectPtr::~SQObjectPtr(&local_98);
      SQVM::Push(v,(SQObjectPtr *)&local_78);
      if (2 < SVar8) {
        SQVM::Push(v,(SQObjectPtr *)&local_48);
      }
      if (3 < SVar8) {
        local_98.super_SQObject._type = OT_TABLE;
        local_98.super_SQObject._flags = '\0';
        pSVar1 = &((this.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
        local_98.super_SQObject._unVal = this;
        SQVM::Push(v,&local_98);
        SQObjectPtr::~SQObjectPtr(&local_98);
      }
      SVar7 = sq_call(v,SVar8,1,1);
      if (SVar7 < 0) break;
      pSVar5 = SQVM::GetUp(v,-1);
      SQTable::NewSlot(local_50.pTable,(SQObjectPtr *)&local_48,pSVar5);
      SQVM::Pop(v);
    }
  } while ((v->_lasterror).super_SQObject._type == OT_NULL);
LAB_0011ca1b:
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_78);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_48);
  SQObjectPtr::~SQObjectPtr(&local_a8);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_68);
  SVar8 = -1;
  if (SVar6.pTable == (SQTable *)0xffffffffffffffff) {
    SVar8 = 1;
    SQVM::Push(v,&local_88);
  }
  SQObjectPtr::~SQObjectPtr(&local_88);
  return SVar8;
}

Assistant:

static SQInteger table_map(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v, 1);
    SQObjectPtr ret = SQTable::Create(_ss(v), _table(o)->CountUsed());
    if(SQ_FAILED(__map_table(_table(ret), _table(o), v)))
        return SQ_ERROR;
    v->Push(ret);
    return 1;
}